

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O1

void __thiscall
wasm::StructUtils::
StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
::noteExpressionOrCopy
          (StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
           *this,Expression *expr,HeapType type,Index index,FieldInfo *info)

{
  PassRunner *pPVar1;
  Module *module;
  uintptr_t uVar2;
  Expression **ppEVar3;
  undefined4 in_register_0000000c;
  Expression *pEVar4;
  Expression *pEVar5;
  Expression *local_50;
  undefined1 *local_48;
  Expression *local_40;
  Id local_34;
  
  local_48 = (undefined1 *)CONCAT44(in_register_0000000c,index);
  local_34 = (Id)type.id;
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
           ).super_Pass.runner;
  module = (this->
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
           ).
           super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
           .
           super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
           .currModule;
  local_40 = expr;
  do {
    pEVar5 = expr;
    local_50 = pEVar5;
    ppEVar3 = Properties::getImmediateFallthroughPtr(&local_50,&pPVar1->options,module,AllowTeeBrIf)
    ;
    expr = *ppEVar3;
  } while (*ppEVar3 != pEVar5);
  pEVar4 = local_40;
  if ((pEVar5->type).id == (local_40->type).id) {
    pEVar4 = pEVar5;
  }
  if (((pEVar4->_id == StructGetId) && (pEVar4[1]._id == local_34)) &&
     (uVar2 = pEVar4[1].type.id, *(long *)(uVar2 + 8) != 1)) {
    wasm::Type::getHeapType((Type *)(uVar2 + 8));
  }
  *local_48 = 1;
  return;
}

Assistant:

void
  noteExpressionOrCopy(Expression* expr, HeapType type, Index index, T& info) {
    // Look at the value falling through, if it has the exact same type
    // (otherwise, we'd need to consider both the type actually written and the
    // type of the fallthrough, somehow).
    auto* fallthrough = Properties::getFallthrough(
      expr,
      this->getPassOptions(),
      *this->getModule(),
      static_cast<SubType*>(this)->getFallthroughBehavior());
    if (fallthrough->type == expr->type) {
      expr = fallthrough;
    }
    if (auto* get = expr->dynCast<StructGet>()) {
      if (get->index == index && get->ref->type != Type::unreachable &&
          get->ref->type.getHeapType() == type) {
        static_cast<SubType*>(this)->noteCopy(type, index, info);
        return;
      }
    }
    static_cast<SubType*>(this)->noteExpression(expr, type, index, info);
  }